

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_mgau.c
# Opt level: O3

int32 model_set_mllr(ms_mgau_model_t *msg,char *mllrfile,char *cb2mllrfile,feat_t *fcb,mdef_t *mdef,
                    cmd_ln_t *config)

{
  gauden_t *pgVar1;
  int32 iVar2;
  int iVar3;
  char *pcVar4;
  void *ptr;
  senone_t *psVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  int32 *cb2mllr;
  int32 nclass;
  float32 ***H;
  float32 ***B;
  float32 ****A;
  cmd_ln_t *local_48;
  char *local_40;
  uint32 nmllr;
  uint32 ncb;
  
  pgVar1 = msg->g;
  local_40 = cb2mllrfile;
  pcVar4 = cmd_ln_str_r(config,"-mean");
  gauden_mean_reload(pgVar1,pcVar4);
  pgVar1 = msg->g;
  local_48 = config;
  pcVar4 = cmd_ln_str_r(config,"-var");
  gauden_var_reload(pgVar1,pcVar4);
  iVar2 = ms_mllr_read_regmat(mllrfile,&A,&B,&H,(int32 *)fcb->stream_len,fcb->n_stream,&nclass);
  pcVar4 = local_40;
  if (iVar2 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
            ,0x60,"ms_mllr_read_regmat failed\n");
LAB_0011836a:
    exit(1);
  }
  if (local_40 != (char *)0x0) {
    iVar3 = strcmp(local_40,".1cls.");
    if (iVar3 != 0) {
      cb2mllr_read(pcVar4,&cb2mllr,&ncb,&nmllr);
      if (nmllr == nclass) {
        if (ncb == msg->s->n_sen) goto LAB_0011820a;
        pcVar4 = "Number of senones in cb2mllr does not match mdef (%d != %d)\n";
        lVar6 = 0x6d;
      }
      else {
        pcVar4 = "Number of classes in cb2mllr does not match mllr (%d != %d)\n";
        lVar6 = 0x69;
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
              ,lVar6,pcVar4);
      goto LAB_0011836a;
    }
  }
  cb2mllr = (int32 *)0x0;
LAB_0011820a:
  ptr = __ckd_calloc__((long)msg->g->n_mgau,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_mgau.c"
                       ,0x73);
  psVar5 = msg->s;
  if (0 < psVar5->n_sen) {
    uVar7 = 0;
    do {
      iVar3 = 0;
      if ((((cb2mllr == (int32 *)0x0) || (iVar3 = cb2mllr[uVar7], iVar3 != -1)) &&
          (uVar7 != (uint)(int)mdef->cd2cisen[uVar7])) &&
         (lVar6 = (long)psVar5->mgau[uVar7], *(char *)((long)ptr + lVar6) == '\0')) {
        pgVar1 = msg->g;
        ms_mllr_norm_mgau(pgVar1->mean[lVar6],pgVar1->var[lVar6],pgVar1->n_density,A,B,H,
                          (int32 *)fcb->stream_len,fcb->n_stream,iVar3);
        *(undefined1 *)((long)ptr + lVar6) = 1;
        psVar5 = msg->s;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)psVar5->n_sen);
  }
  pgVar1 = msg->g;
  dVar8 = cmd_ln_float_r(local_48,"-varfloor");
  gauden_dist_precompute(pgVar1,(float32)(float)dVar8);
  ckd_free(ptr);
  ms_mllr_free_regmat(A,B,H,fcb->n_stream);
  ckd_free(cb2mllr);
  return 0;
}

Assistant:

int32
model_set_mllr(ms_mgau_model_t * msg, const char *mllrfile,
	       const char *cb2mllrfile, feat_t * fcb, mdef_t * mdef,
	       cmd_ln_t *config)
{
    float32 ****A, ***B, ***H;
    int32 *cb2mllr;
    int32 gid, sid, nclass;
    uint8 *mgau_xform;

    gauden_mean_reload(msg->g, cmd_ln_str_r(config, "-mean"));
    gauden_var_reload(msg->g, cmd_ln_str_r(config, "-var"));

    if (ms_mllr_read_regmat(mllrfile, &A, &B, &H,
                            fcb->stream_len, feat_n_stream(fcb),
                            &nclass) < 0)
        E_FATAL("ms_mllr_read_regmat failed\n");

    if (cb2mllrfile && strcmp(cb2mllrfile, ".1cls.") != 0) {
        uint32 ncb, nmllr;

        cb2mllr_read(cb2mllrfile, &cb2mllr, &ncb, &nmllr);
        if (nmllr != nclass)
            E_FATAL
                ("Number of classes in cb2mllr does not match mllr (%d != %d)\n",
                 ncb, nclass);
        if (ncb != msg->s->n_sen)
            E_FATAL
                ("Number of senones in cb2mllr does not match mdef (%d != %d)\n",
                 ncb, msg->s->n_sen);
    }
    else
        cb2mllr = NULL;


    mgau_xform = (uint8 *) ckd_calloc(msg->g->n_mgau, sizeof(uint8));

    /* Transform each non-CI mixture Gaussian */
    for (sid = 0; sid < msg->s->n_sen; sid++) {
        int32 class = 0;

        if (cb2mllr)
            class = cb2mllr[sid];
        if (class == -1)
            continue;

        if (mdef->cd2cisen[sid] != sid) {       /* Otherwise it's a CI senone */
            gid = msg->s->mgau[sid];
            if (!mgau_xform[gid]) {
                ms_mllr_norm_mgau(msg->g->mean[gid],
				  msg->g->var[gid],
				  msg->g->n_density,
				  A, B, H,
				  fcb->stream_len, feat_n_stream(fcb),
                                  class);
                mgau_xform[gid] = 1;
            }
        }
    }

    gauden_dist_precompute(msg->g, cmd_ln_float32_r(config, "-varfloor"));
    ckd_free(mgau_xform);

    ms_mllr_free_regmat(A, B, H, feat_n_stream(fcb));
    ckd_free(cb2mllr);

    return S3_SUCCESS;
}